

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O2

int __thiscall File::open(File *this,char *__file,int __oflag,...)

{
  uint __line;
  bool bVar1;
  long *plVar2;
  enable_if_t<is_constructible_v<variant_alternative_t<1UL,_variant<basic_streambuf<char>_*,_basic_filebuf<char>_>_>_>,_variant_alternative_t<1UL,_variant<basic_streambuf<char>_*,_basic_filebuf<char>_>_>_&>
  this_00;
  _If_fs_path<std::filesystem::__cxx11::path,___filebuf_type_*> pbVar3;
  char *__assertion;
  path local_50;
  
  std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
            (&local_50,(char (*) [2])"-",auto_format);
  bVar1 = std::filesystem::__cxx11::operator==((path *)__file,&local_50);
  std::filesystem::__cxx11::path::~path(&local_50);
  if (bVar1) {
    if ((__oflag & 8U) == 0) {
      if ((__oflag & 0x10U) == 0) {
        __assertion = "mode & std::ios_base::out";
        __line = 0x38;
LAB_0010574d:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/include/file.hpp"
                      ,__line,"open");
      }
      plVar2 = &std::cout;
    }
    else {
      if ((__oflag & 0x10U) != 0) {
        __assertion = "!(mode & std::ios_base::out)";
        __line = 0x31;
        goto LAB_0010574d;
      }
      plVar2 = &std::cin;
    }
    local_50._M_pathname._M_dataplus._M_p =
         *(pointer *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0xe8);
    std::variant<std::streambuf*,std::filebuf>::emplace<0ul,std::streambuf*>
              ((variant<std::streambuf*,std::filebuf> *)this,
               (basic_streambuf<char,_std::char_traits<char>_> **)&local_50);
  }
  else {
    this_00 = std::variant<std::streambuf*,std::filebuf>::emplace<1ul>
                        ((variant<std::streambuf*,std::filebuf> *)this);
    pbVar3 = std::basic_filebuf<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                       (this_00,(path *)__file,__oflag);
    if (pbVar3 == (_If_fs_path<std::filesystem::__cxx11::path,___filebuf_type_*>)0x0) {
      this = (File *)0x0;
    }
  }
  return (int)this;
}

Assistant:

File *open(std::filesystem::path const &path, std::ios_base::openmode mode) {
		if (path != "-") {
			return _file.emplace<std::filebuf>().open(path, mode) ? this : nullptr;
		} else if (mode & std::ios_base::in) {
			assert(!(mode & std::ios_base::out));
			_file.emplace<std::streambuf *>(std::cin.rdbuf());
			if (setmode(STDIN_FILENO, mode & std::ios_base::binary ? O_BINARY : O_TEXT) == -1) {
				fatal("Failed to set stdin to %s mode: %s",
				      mode & std::ios_base::binary ? "binary" : "text", strerror(errno));
			}
		} else {
			assert(mode & std::ios_base::out);
			_file.emplace<std::streambuf *>(std::cout.rdbuf());
		}
		return this;
	}